

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

Matrix3f * Matrix3f::scaling(float sx,float sy,float sz)

{
  Matrix3f *in_RDI;
  
  in_RDI->m_elements[0] = sx;
  in_RDI->m_elements[1] = 0.0;
  in_RDI->m_elements[2] = 0.0;
  in_RDI->m_elements[3] = 0.0;
  in_RDI->m_elements[4] = sy;
  in_RDI->m_elements[5] = 0.0;
  in_RDI->m_elements[6] = 0.0;
  in_RDI->m_elements[7] = 0.0;
  in_RDI->m_elements[8] = sz;
  return in_RDI;
}

Assistant:

Matrix3f Matrix3f::scaling( float sx, float sy, float sz )
{
	return Matrix3f
	(
		sx, 0, 0,
		0, sy, 0,
		0, 0, sz
	);
}